

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.cpp
# Opt level: O2

bool __thiscall
tonk::ConnectionIdMap::InsertAndAssignId(ConnectionIdMap *this,id_t *idOut,IConnection *connection)

{
  uint uVar1;
  insert_result iVar2;
  id_t iVar3;
  id_t *k;
  bool bVar4;
  Locker locker;
  Locker local_48;
  IConnection *local_40;
  id_t *local_38;
  
  local_48.TheLock = &this->IdLock;
  std::recursive_mutex::lock(&(local_48.TheLock)->cs);
  if (this->BestUnusedCount == 0) {
    if ((this->IdMap).TheMap.m_num_valid < 0x1000000) {
      k = &this->NextId;
      local_38 = idOut;
      do {
        iVar3 = *k + 1;
        if (*k - 0xffffff < 0xff000100) {
          iVar3 = 0x100;
        }
        *k = iVar3;
        local_40 = connection;
        iVar2 = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::insert
                          (&(this->IdMap).TheMap,k,&local_40);
      } while (((ulong)iVar2 & 0x100000000) == 0);
      bVar4 = true;
      *local_38 = *k;
      goto LAB_00122c6f;
    }
  }
  else {
    uVar1 = this->BestUnusedCount - 1;
    this->BestUnusedCount = uVar1;
    *idOut = (uint)this->BestUnusedIds[uVar1];
    local_40 = connection;
    iVar2 = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::insert
                      (&(this->IdMap).TheMap,idOut,&local_40);
    bVar4 = true;
    if (((ulong)iVar2 >> 0x20 & 1) != 0) goto LAB_00122c6f;
    this->BestUnusedCount = this->BestUnusedCount + 1;
  }
  bVar4 = false;
LAB_00122c6f:
  Locker::~Locker(&local_48);
  return bVar4;
}

Assistant:

bool ConnectionIdMap::InsertAndAssignId(
    id_t& idOut,
    IConnection* connection)
{
    Locker locker(IdLock);

    if (BestUnusedCount > 0)
    {
        idOut = BestUnusedIds[--BestUnusedCount];
        const bool success = IdMap.Insert(idOut, connection);
        if (!success) {
            ++BestUnusedCount;
        }
        //ModuleLogger.Trace("ID ADD ", idOut, " + ", connection, " - ", success);
        return success;
    }

    if (IdMap.GetCount() >= protocol::kConnectionIdCount)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return false;
    }

    // Find next unused Id
    do
    {
        ++NextId;
        if (NextId < 256 || NextId >= protocol::kConnectionIdCount) {
            NextId = 256;
        }
    } while (!IdMap.Insert(NextId, connection));

    idOut = NextId;
    return true;
}